

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

roaring_bitmap_t * roaring_bitmap_flip(roaring_bitmap_t *x1,uint64_t range_start,uint64_t range_end)

{
  _Bool cow;
  ulong in_RDX;
  ulong in_RSI;
  roaring_bitmap_t *in_RDI;
  uint32_t hb;
  uint16_t lb_end;
  uint16_t hb_end;
  uint16_t lb_start;
  uint16_t hb_start;
  roaring_bitmap_t *ans;
  roaring_array_t *in_stack_ffffffffffffff88;
  undefined6 in_stack_ffffffffffffff90;
  undefined2 in_stack_ffffffffffffff96;
  uint16_t uVar1;
  uint16_t lb_start_00;
  undefined8 in_stack_ffffffffffffffa0;
  uint16_t hb_00;
  roaring_bitmap_t *in_stack_ffffffffffffffa8;
  roaring_array_t *x1_arr;
  undefined6 in_stack_ffffffffffffffb0;
  ushort uVar2;
  uint local_34;
  ushort local_2e;
  ushort local_2a;
  ulong local_20;
  roaring_array_t *local_8;
  
  if (in_RSI < in_RDX) {
    local_20 = in_RDX;
    if (0xffffffff < in_RDX) {
      local_20 = 0;
    }
    local_8 = &roaring_bitmap_create()->high_low_container;
    x1_arr = local_8;
    cow = is_cow(in_RDI);
    roaring_bitmap_set_copy_on_write((roaring_bitmap_t *)x1_arr,cow);
    local_2a = (ushort)(in_RSI >> 0x10);
    local_2e = (ushort)(local_20 - 1 >> 0x10);
    uVar2 = local_2a;
    is_cow(in_RDI);
    ra_append_copies_until
              ((roaring_array_t *)CONCAT26(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88,0,false);
    uVar1 = (uint16_t)((ulong)in_stack_ffffffffffffffa0 >> 0x10);
    lb_start_00 = (uint16_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
    hb_00 = (uint16_t)((ulong)in_stack_ffffffffffffffa0 >> 0x30);
    if (local_2a == local_2e) {
      insert_flipped_container
                ((roaring_array_t *)CONCAT26(uVar2,in_stack_ffffffffffffffb0),x1_arr,hb_00,
                 lb_start_00,uVar1);
    }
    else {
      if ((short)in_RSI != 0) {
        insert_flipped_container
                  ((roaring_array_t *)CONCAT26(uVar2,in_stack_ffffffffffffffb0),x1_arr,hb_00,
                   lb_start_00,uVar1);
        local_2a = local_2a + 1;
      }
      if ((short)local_20 != 0) {
        local_2e = local_2e - 1;
      }
      for (local_34 = (uint)local_2a; uVar1 = (uint16_t)((ulong)in_stack_ffffffffffffffa0 >> 0x30),
          local_34 <= local_2e; local_34 = local_34 + 1) {
        insert_fully_flipped_container
                  ((roaring_array_t *)CONCAT26(uVar2,in_stack_ffffffffffffffb0),x1_arr,uVar1);
      }
      if ((short)local_20 != 0) {
        insert_flipped_container
                  ((roaring_array_t *)CONCAT26(uVar2,in_stack_ffffffffffffffb0),x1_arr,uVar1,
                   (uint16_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                   (uint16_t)((ulong)in_stack_ffffffffffffffa0 >> 0x10));
        local_2e = local_2e + 1;
      }
    }
    is_cow(in_RDI);
    ra_append_copies_after
              ((roaring_array_t *)CONCAT26(local_2e,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88,0,false);
  }
  else {
    local_8 = &roaring_bitmap_copy(in_stack_ffffffffffffffa8)->high_low_container;
  }
  return (roaring_bitmap_t *)local_8;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_flip(const roaring_bitmap_t *x1,
                                      uint64_t range_start,
                                      uint64_t range_end) {
    if (range_start >= range_end) {
        return roaring_bitmap_copy(x1);
    }
    if (range_end >= UINT64_C(0x100000000)) {
        range_end = UINT64_C(0x100000000);
    }

    roaring_bitmap_t *ans = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(ans, is_cow(x1));

    uint16_t hb_start = (uint16_t)(range_start >> 16);
    const uint16_t lb_start = (uint16_t)range_start;  // & 0xFFFF;
    uint16_t hb_end = (uint16_t)((range_end - 1) >> 16);
    const uint16_t lb_end = (uint16_t)(range_end - 1);  // & 0xFFFF;

    ra_append_copies_until(&ans->high_low_container, &x1->high_low_container,
                           hb_start, is_cow(x1));
    if (hb_start == hb_end) {
        insert_flipped_container(&ans->high_low_container,
                                 &x1->high_low_container, hb_start, lb_start,
                                 lb_end);
    } else {
        // start and end containers are distinct
        if (lb_start > 0) {
            // handle first (partial) container
            insert_flipped_container(&ans->high_low_container,
                                     &x1->high_low_container, hb_start,
                                     lb_start, 0xFFFF);
            ++hb_start;  // for the full containers.  Can't wrap.
        }

        if (lb_end != 0xFFFF) --hb_end;  // later we'll handle the partial block

        for (uint32_t hb = hb_start; hb <= hb_end; ++hb) {
            insert_fully_flipped_container(&ans->high_low_container,
                                           &x1->high_low_container,
                                           (uint16_t)hb);
        }

        // handle a partial final container
        if (lb_end != 0xFFFF) {
            insert_flipped_container(&ans->high_low_container,
                                     &x1->high_low_container, hb_end + 1, 0,
                                     lb_end);
            ++hb_end;
        }
    }
    ra_append_copies_after(&ans->high_low_container, &x1->high_low_container,
                           hb_end, is_cow(x1));
    return ans;
}